

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

void oonf_log_updatemask(void)

{
  byte bVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_log_handler_entry *poStack_28;
  uint8_t mask;
  oonf_log_handler_entry *iterator;
  oonf_log_handler_entry *h;
  oonf_log_source src;
  
  memset(log_global_mask,0xc,0x80);
  iterator = (oonf_log_handler_entry *)_handler_list.next;
  poStack_28 = (oonf_log_handler_entry *)(_handler_list.next)->next;
  while( true ) {
    if ((iterator->_node).prev == _handler_list.prev) break;
    for (h._4_4_ = 0; h._4_4_ < 0x80; h._4_4_ = h._4_4_ + 1) {
      bVar1 = iterator->user_bitmask[h._4_4_] | iterator->user_bitmask[0];
      bVar1 = bVar1 | bVar1 << 1;
      bVar1 = bVar1 | bVar1 << 2;
      iterator->_processed_bitmask[h._4_4_] = bVar1;
      log_global_mask[h._4_4_] = log_global_mask[h._4_4_] | bVar1;
    }
    iterator = poStack_28;
    poStack_28 = (oonf_log_handler_entry *)(poStack_28->_node).next;
  }
  return;
}

Assistant:

void
oonf_log_updatemask(void) {
  enum oonf_log_source src;
  struct oonf_log_handler_entry *h, *iterator;
  uint8_t mask;

  /* first reset global mask */
  oonf_log_mask_clear(log_global_mask);

  list_for_each_element_safe(&_handler_list, h, _node, iterator) {
    for (src = 0; src < LOG_MAXIMUM_SOURCES; src++) {
      /* copy user defined mask */
      mask = h->user_bitmask[src];

      /* apply 'all' source mask */
      mask |= h->user_bitmask[LOG_ALL];

      /* propagate severities from lower to higher level */
      mask |= mask << 1;
      mask |= mask << 2;

      /*
       * we don't need the third shift because we have
       * 4 or less severity level
       */
#if 0
      mask |= mask << 4;
#endif

      /* write calculated mask into internal buffer */
      h->_processed_bitmask[src] = mask;

      /* apply calculated mask to the global one */
      log_global_mask[src] |= mask;
    }
  }
}